

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkIsAcyclic_rec(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pNtk_00;
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  int local_30;
  int i;
  int fAcyclic;
  Abc_Obj_t *pFanin;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode_local;
  
  pNtk_00 = pNode->pNtk;
  iVar2 = Abc_ObjIsNet(pNode);
  if (iVar2 != 0) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x5ff,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
  }
  iVar2 = Abc_ObjIsCi(pNode);
  if (((iVar2 == 0) && (iVar2 = Abc_ObjIsBox(pNode), iVar2 == 0)) &&
     ((iVar2 = Abc_NtkIsStrash(pNode->pNtk), iVar2 == 0 ||
      (iVar2 = Abc_AigNodeIsConst(pNode), iVar2 == 0)))) {
    iVar2 = Abc_ObjIsNode(pNode);
    if (iVar2 == 0) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x602,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
    }
    iVar2 = Abc_NodeIsTravIdPrevious(pNode);
    if (iVar2 != 0) {
      __assert_fail("!Abc_NodeIsTravIdPrevious(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x604,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
    }
    iVar2 = Abc_NodeIsTravIdCurrent(pNode);
    pFVar1 = _stdout;
    if (iVar2 == 0) {
      Abc_NodeSetTravIdCurrent(pNode);
      for (local_30 = 0; iVar2 = Abc_ObjFaninNum(pNode), local_30 < iVar2; local_30 = local_30 + 1)
      {
        pAVar4 = Abc_ObjFanin(pNode,local_30);
        pAVar4 = Abc_ObjFanin0Ntk(pAVar4);
        if (pAVar4->pNtk != pNode->pNtk) {
          __assert_fail("pFanin->pNtk == pNode->pNtk",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                        ,0x613,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
        }
        iVar2 = Abc_NodeIsTravIdPrevious(pAVar4);
        if ((iVar2 == 0) && (iVar2 = Abc_NtkIsAcyclic_rec(pAVar4), pFVar1 = _stdout, iVar2 == 0)) {
          pcVar3 = Abc_ObjName(pAVar4);
          fprintf(pFVar1," %s ->",pcVar3);
          return 0;
        }
      }
      iVar2 = Abc_NtkIsStrash(pNode->pNtk);
      if ((iVar2 != 0) && (iVar2 = Abc_AigNodeIsChoice(pNode), iVar2 != 0)) {
        for (_i = (Abc_Obj_t *)(pNode->field_5).pData; _i != (Abc_Obj_t *)0x0;
            _i = (Abc_Obj_t *)(_i->field_5).pData) {
          iVar2 = Abc_NodeIsTravIdPrevious(_i);
          if ((iVar2 == 0) && (iVar2 = Abc_NtkIsAcyclic_rec(_i), pFVar1 = _stdout, iVar2 == 0)) {
            pcVar3 = Abc_ObjName(_i);
            fprintf(pFVar1," %s",pcVar3);
            pFVar1 = _stdout;
            pcVar3 = Abc_ObjName(pNode);
            fprintf(pFVar1," (choice of %s) -> ",pcVar3);
            return 0;
          }
        }
      }
      Abc_NodeSetTravIdPrevious(pNode);
      pNode_local._4_4_ = 1;
    }
    else {
      pcVar3 = Abc_NtkName(pNtk_00);
      fprintf(pFVar1,"Network \"%s\" contains combinational loop!\n",pcVar3);
      pFVar1 = _stdout;
      pcVar3 = Abc_ObjName(pNode);
      fprintf(pFVar1,"Node \"%s\" is encountered twice on the following path to the COs:\n",pcVar3);
      pNode_local._4_4_ = 0;
    }
  }
  else {
    pNode_local._4_4_ = 1;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NtkIsAcyclic_rec( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    Abc_Obj_t * pFanin;
    int fAcyclic, i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsCi(pNode) || Abc_ObjIsBox(pNode) || (Abc_NtkIsStrash(pNode->pNtk) && Abc_AigNodeIsConst(pNode)) )
        return 1;
    assert( Abc_ObjIsNode(pNode) );
    // make sure the node is not visited
    assert( !Abc_NodeIsTravIdPrevious(pNode) );
    // check if the node is part of the combinational loop
    if ( Abc_NodeIsTravIdCurrent(pNode) )
    {
        fprintf( stdout, "Network \"%s\" contains combinational loop!\n", Abc_NtkName(pNtk) );
        fprintf( stdout, "Node \"%s\" is encountered twice on the following path to the COs:\n", Abc_ObjName(pNode) );
        return 0;
    }
    // mark this node as a node on the current path
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    Abc_ObjForEachFanin( pNode, pFanin, i )
    { 
        pFanin = Abc_ObjFanin0Ntk(pFanin);
        // make sure there is no mixing of networks
        assert( pFanin->pNtk == pNode->pNtk );
        // check if the fanin is visited
        if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
            continue;
        // traverse the fanin's cone searching for the loop
        if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pFanin)) )
            continue;
        // return as soon as the loop is detected
        fprintf( stdout, " %s ->", Abc_ObjName(pFanin) );
        return 0;
    }
    // visit choices
    if ( Abc_NtkIsStrash(pNode->pNtk) && Abc_AigNodeIsChoice(pNode) )
    {
        for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
        {
            // check if the fanin is visited
            if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
                continue;
            // traverse the fanin's cone searching for the loop
            if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pFanin)) )
                continue;
            // return as soon as the loop is detected
            fprintf( stdout, " %s", Abc_ObjName(pFanin) );
            fprintf( stdout, " (choice of %s) -> ", Abc_ObjName(pNode) );
            return 0;
        }
    }
    // mark this node as a visited node
    Abc_NodeSetTravIdPrevious( pNode );
    return 1;
}